

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::BatchNormParameter::ByteSizeLong(BatchNormParameter *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  size_t sVar2;
  size_t sVar3;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar2 = 0;
  }
  else {
    unknown_fields = BatchNormParameter::unknown_fields(this);
    sVar2 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    sVar3 = sVar2 + 5 + (ulong)(uVar1 & 1) * 2;
    if ((uVar1 & 2) == 0) {
      sVar3 = sVar2 + (ulong)(uVar1 & 1) * 2;
    }
    sVar2 = sVar3 + 5;
    if ((uVar1 & 4) == 0) {
      sVar2 = sVar3;
    }
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t BatchNormParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.BatchNormParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional bool use_global_stats = 1;
    if (has_use_global_stats()) {
      total_size += 1 + 1;
    }

    // optional float moving_average_fraction = 2 [default = 0.999];
    if (has_moving_average_fraction()) {
      total_size += 1 + 4;
    }

    // optional float eps = 3 [default = 1e-05];
    if (has_eps()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}